

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

_Bool CheckCollisionLines(Vector2 startPos1,Vector2 endPos1,Vector2 startPos2,Vector2 endPos2,
                         Vector2 *collisionPoint)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float yi;
  float xi;
  float div;
  Vector2 *collisionPoint_local;
  float fStack_28;
  Vector2 endPos2_local;
  Vector2 startPos2_local;
  Vector2 endPos1_local;
  Vector2 startPos1_local;
  
  fStack_28 = endPos2.y;
  endPos2_local.y = startPos2.y;
  startPos2_local.x = endPos1.x;
  endPos1_local.x = startPos1.x;
  collisionPoint_local._4_4_ = endPos2.x;
  endPos2_local.x = startPos2.x;
  startPos2_local.y = endPos1.y;
  endPos1_local.y = startPos1.y;
  fVar2 = (fStack_28 - endPos2_local.y) * (startPos2_local.x - endPos1_local.x) +
          -((collisionPoint_local._4_4_ - endPos2_local.x) * (startPos2_local.y - endPos1_local.y));
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar3 = ((endPos2_local.x - collisionPoint_local._4_4_) *
             (endPos1_local.x * startPos2_local.y + -(endPos1_local.y * startPos2_local.x)) +
            -((endPos1_local.x - startPos2_local.x) *
             (endPos2_local.x * fStack_28 + -(endPos2_local.y * collisionPoint_local._4_4_)))) /
            fVar2;
    fVar2 = ((endPos2_local.y - fStack_28) *
             (endPos1_local.x * startPos2_local.y + -(endPos1_local.y * startPos2_local.x)) +
            -((endPos1_local.y - startPos2_local.y) *
             (endPos2_local.x * fStack_28 + -(endPos2_local.y * collisionPoint_local._4_4_)))) /
            fVar2;
    fVar4 = startPos2_local.x;
    if (endPos1_local.x <= startPos2_local.x) {
      fVar4 = endPos1_local.x;
    }
    if ((float)(~-(uint)NAN(endPos1_local.x) & (uint)fVar4 |
               -(uint)NAN(endPos1_local.x) & (uint)startPos2_local.x) <= fVar3) {
      uVar1 = -(uint)NAN(endPos1_local.x) & (uint)startPos2_local.x;
      if (startPos2_local.x <= endPos1_local.x) {
        startPos2_local.x = endPos1_local.x;
      }
      if (fVar3 <= (float)(~-(uint)NAN(endPos1_local.x) & (uint)startPos2_local.x | uVar1)) {
        fVar4 = collisionPoint_local._4_4_;
        if (endPos2_local.x <= collisionPoint_local._4_4_) {
          fVar4 = endPos2_local.x;
        }
        if ((float)(~-(uint)NAN(endPos2_local.x) & (uint)fVar4 |
                   -(uint)NAN(endPos2_local.x) & (uint)collisionPoint_local._4_4_) <= fVar3) {
          uVar1 = -(uint)NAN(endPos2_local.x) & (uint)collisionPoint_local._4_4_;
          if (collisionPoint_local._4_4_ <= endPos2_local.x) {
            collisionPoint_local._4_4_ = endPos2_local.x;
          }
          if (fVar3 <= (float)(~-(uint)NAN(endPos2_local.x) & (uint)collisionPoint_local._4_4_ |
                              uVar1)) {
            fVar4 = startPos2_local.y;
            if (endPos1_local.y <= startPos2_local.y) {
              fVar4 = endPos1_local.y;
            }
            if ((float)(~-(uint)NAN(endPos1_local.y) & (uint)fVar4 |
                       -(uint)NAN(endPos1_local.y) & (uint)startPos2_local.y) <= fVar2) {
              uVar1 = -(uint)NAN(endPos1_local.y) & (uint)startPos2_local.y;
              if (startPos2_local.y <= endPos1_local.y) {
                startPos2_local.y = endPos1_local.y;
              }
              if (fVar2 <= (float)(~-(uint)NAN(endPos1_local.y) & (uint)startPos2_local.y | uVar1))
              {
                fVar4 = fStack_28;
                if (endPos2_local.y <= fStack_28) {
                  fVar4 = endPos2_local.y;
                }
                if ((float)(~-(uint)NAN(endPos2_local.y) & (uint)fVar4 |
                           -(uint)NAN(endPos2_local.y) & (uint)fStack_28) <= fVar2) {
                  uVar1 = -(uint)NAN(endPos2_local.y) & (uint)fStack_28;
                  if (fStack_28 <= endPos2_local.y) {
                    fStack_28 = endPos2_local.y;
                  }
                  if (fVar2 <= (float)(~-(uint)NAN(endPos2_local.y) & (uint)fStack_28 | uVar1)) {
                    if (collisionPoint != (Vector2 *)0x0) {
                      collisionPoint->x = fVar3;
                      collisionPoint->y = fVar2;
                    }
                    return true;
                  }
                }
                return false;
              }
            }
            return false;
          }
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool CheckCollisionLines(Vector2 startPos1, Vector2 endPos1, Vector2 startPos2, Vector2 endPos2, Vector2 *collisionPoint)
{
    const float div = (endPos2.y - startPos2.y)*(endPos1.x - startPos1.x) - (endPos2.x - startPos2.x)*(endPos1.y - startPos1.y);

    if (div == 0.0f) return false;      // WARNING: This check could not work due to float precision rounding issues...

    const float xi = ((startPos2.x - endPos2.x)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.x - endPos1.x)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;
    const float yi = ((startPos2.y - endPos2.y)*(startPos1.x*endPos1.y - startPos1.y*endPos1.x) - (startPos1.y - endPos1.y)*(startPos2.x*endPos2.y - startPos2.y*endPos2.x))/div;

    if (xi < fminf(startPos1.x, endPos1.x) || xi > fmaxf(startPos1.x, endPos1.x)) return false;
    if (xi < fminf(startPos2.x, endPos2.x) || xi > fmaxf(startPos2.x, endPos2.x)) return false;
    if (yi < fminf(startPos1.y, endPos1.y) || yi > fmaxf(startPos1.y, endPos1.y)) return false;
    if (yi < fminf(startPos2.y, endPos2.y) || yi > fmaxf(startPos2.y, endPos2.y)) return false;

    if (collisionPoint != 0)
    {
        collisionPoint->x = xi;
        collisionPoint->y = yi;
    }

    return true;
}